

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int Curl_poll(pollfd *ufds,uint nfds,int timeout_ms)

{
  pollfd *ppVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ushort uVar7;
  int iVar8;
  ulong __nfds;
  timeval older;
  timeval newer;
  
  if (ufds != (pollfd *)0x0) {
    __nfds = (ulong)nfds;
    uVar6 = 0;
    while (__nfds != uVar6) {
      ppVar1 = ufds + uVar6;
      uVar6 = uVar6 + 1;
      if (ppVar1->fd != -1) {
        if (timeout_ms < 1) {
          iVar8 = 0;
          older = (timeval)ZEXT816(0);
        }
        else {
          older = curlx_tvnow();
          iVar8 = timeout_ms;
        }
        do {
          if (timeout_ms == 0) {
            iVar8 = timeout_ms;
          }
          if (timeout_ms < 0) {
            iVar8 = -1;
          }
          iVar3 = poll((pollfd *)ufds,__nfds,iVar8);
          if (iVar3 != -1) {
            if (iVar3 < 0) {
              return -1;
            }
            if (iVar3 == 0) {
              return 0;
            }
            for (uVar6 = 0; __nfds != uVar6; uVar6 = uVar6 + 1) {
              if ((ufds[uVar6].fd != -1) && (uVar2 = ufds[uVar6].revents, (uVar2 & 0x18) != 0)) {
                uVar7 = uVar2 >> 4 & 1;
                if ((uVar2 & 8) != 0) {
                  uVar7 = 5;
                }
                ufds[uVar6].revents = uVar7 | uVar2;
              }
            }
            return iVar3;
          }
          piVar4 = __errno_location();
          if (*piVar4 != 0) {
            if (*piVar4 != 4) {
              return -1;
            }
            if (Curl_ack_eintr != 0) {
              return -1;
            }
          }
          if (0 < timeout_ms) {
            newer = curlx_tvnow();
            lVar5 = curlx_tvdiff(newer,older);
            iVar8 = timeout_ms - (int)lVar5;
            if (iVar8 == 0 || timeout_ms < (int)lVar5) {
              return 0;
            }
          }
        } while( true );
      }
    }
  }
  iVar8 = Curl_wait_ms(timeout_ms);
  return iVar8;
}

Assistant:

int Curl_poll(struct pollfd ufds[], unsigned int nfds, int timeout_ms)
{
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct timeval initial_tv = {0, 0};
  bool fds_none = TRUE;
  unsigned int i;
  int pending_ms = 0;
  int error;
  int r;

  if(ufds) {
    for(i = 0; i < nfds; i++) {
      if(ufds[i].fd != CURL_SOCKET_BAD) {
        fds_none = FALSE;
        break;
      }
    }
  }
  if(fds_none) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid curlx_tvnow() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = timeout_ms;
    initial_tv = curlx_tvnow();
  }

#ifdef HAVE_POLL_FINE

  do {
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(ufds, nfds, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  for(i = 0; i < nfds; i++) {
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(ufds[i].revents & POLLHUP)
      ufds[i].revents |= POLLIN;
    if(ufds[i].revents & POLLERR)
      ufds[i].revents |= (POLLIN|POLLOUT);
  }

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_read);
  FD_ZERO(&fds_write);
  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    VERIFY_SOCK(ufds[i].fd);
    if(ufds[i].events & (POLLIN|POLLOUT|POLLPRI|
                          POLLRDNORM|POLLWRNORM|POLLRDBAND)) {
      if(ufds[i].fd > maxfd)
        maxfd = ufds[i].fd;
      if(ufds[i].events & (POLLRDNORM|POLLIN))
        FD_SET(ufds[i].fd, &fds_read);
      if(ufds[i].events & (POLLWRNORM|POLLOUT))
        FD_SET(ufds[i].fd, &fds_write);
      if(ufds[i].events & (POLLRDBAND|POLLPRI))
        FD_SET(ufds[i].fd, &fds_err);
    }
  }

#ifdef USE_WINSOCK
  /* WinSock select() can't handle zero events.  See the comment about this in
     Curl_check_socket(). */
  if(fds_read.fd_count == 0 && fds_write.fd_count == 0
     && fds_err.fd_count == 0) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }
#endif

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }
    r = select((int)maxfd + 1,
#ifndef USE_WINSOCK
               &fds_read, &fds_write, &fds_err,
#else
               /* WinSock select() can't handle fd_sets with zero bits set, so
                  don't give it such arguments.  See the comment about this in
                  Curl_check_socket().
               */
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               fds_err.fd_count ? &fds_err : NULL,
#endif
               ptimeout);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  r = 0;
  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(FD_ISSET(ufds[i].fd, &fds_read))
      ufds[i].revents |= POLLIN;
    if(FD_ISSET(ufds[i].fd, &fds_write))
      ufds[i].revents |= POLLOUT;
    if(FD_ISSET(ufds[i].fd, &fds_err))
      ufds[i].revents |= POLLPRI;
    if(ufds[i].revents != 0)
      r++;
  }

#endif  /* HAVE_POLL_FINE */

  return r;
}